

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O0

int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,void *memo,float *out)

{
  vorbis_info_floor *infoX;
  float amp;
  float *lsp;
  vorbis_info_floor0 *info;
  vorbis_look_floor0 *look;
  float *out_local;
  void *memo_local;
  vorbis_look_floor *i_local;
  vorbis_block *vb_local;
  
  infoX = *(vorbis_info_floor **)((long)i + 0x18);
  floor0_map_lazy_init(vb,infoX,(vorbis_look_floor0 *)i);
  if (memo == (void *)0x0) {
    memset(out,0,(long)*(int *)((long)i + vb->W * 4 + 0x10) << 2);
  }
  else {
    vorbis_lsp_to_curve(out,*(int **)(*(long *)((long)i + 8) + vb->W * 8),
                        *(int *)((long)i + vb->W * 4 + 0x10),*i,(float *)memo,*(int *)((long)i + 4),
                        *(float *)((long)memo + (long)*(int *)((long)i + 4) * 4),
                        (float)*(int *)((long)infoX + 0x1c));
  }
  vb_local._4_4_ = (uint)(memo != (void *)0x0);
  return vb_local._4_4_;
}

Assistant:

static int floor0_inverse2(vorbis_block *vb,vorbis_look_floor *i,
                           void *memo,float *out){
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  vorbis_info_floor0 *info=look->vi;

  floor0_map_lazy_init(vb,info,look);

  if(memo){
    float *lsp=(float *)memo;
    float amp=lsp[look->m];

    /* take the coefficients back to a spectral envelope curve */
    vorbis_lsp_to_curve(out,
                        look->linearmap[vb->W],
                        look->n[vb->W],
                        look->ln,
                        lsp,look->m,amp,(float)info->ampdB);
    return(1);
  }
  memset(out,0,sizeof(*out)*look->n[vb->W]);
  return(0);
}